

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O0

_Bool qp_isinvalid(priority_queue *qp)

{
  ulong uVar1;
  size_t parent;
  size_t start;
  priority_queue *qp_local;
  
  if ((qp == (priority_queue *)0x0) || (qp->size < qp->count)) {
    qp_local._7_1_ = true;
  }
  else if (qp->count < 2) {
    qp_local._7_1_ = false;
  }
  else {
    if ((qp->count & 1) == 0) {
      if (qp->data[qp->count - 1].priority < qp->data[qp->count - 2 >> 1].priority) {
        return true;
      }
      parent = qp->count - 2;
    }
    else {
      parent = qp->count - 1;
    }
    for (; 1 < parent; parent = parent - 2) {
      uVar1 = parent - 1 >> 1;
      if ((qp->data[parent].priority < qp->data[uVar1].priority) ||
         (qp->data[parent - 1].priority < qp->data[uVar1].priority)) {
        return true;
      }
    }
    qp_local._7_1_ = false;
  }
  return qp_local._7_1_;
}

Assistant:

bool qp_isinvalid(const struct priority_queue *qp)
{
	size_t start, parent;

	if (!qp || qp->count > qp->size) {
		return true;
	}

	/* Queues with less than two elements have nothing to check. */
	if (qp->count < 2) {
		return false;
	}

	if ((qp->count & 1) == 0) {
		/*
		 * On the deepest layer, there is a node that does not have
		 * a sibling with the same parent.
		 */
		parent = (qp->count - 2) >> 1;
		if (qp->data[qp->count - 1].priority
				< qp->data[parent].priority) {
			return true;
		}
		start = qp->count - 2;
	} else {
		/* All nodes on the deepest layer have a sibling. */
		start = qp->count - 1;
	}

	while (start > 1) {
		parent = (start - 1) >> 1;
		if (qp->data[start].priority < qp->data[parent].priority
				|| qp->data[start - 1].priority
				< qp->data[parent].priority) {
			return true;
		}
		start -= 2;
	}
	return false;
}